

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O2

void RAWToARGBRow_C(uint8 *src_raw,uint8 *dst_argb,int width)

{
  uint8 uVar1;
  uint8 uVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar3 = 0;
  uVar4 = (ulong)(uint)width;
  if (width < 1) {
    uVar4 = uVar3;
  }
  for (; (int)uVar4 != (int)uVar3; uVar3 = uVar3 + 1) {
    uVar1 = *src_raw;
    uVar2 = src_raw[1];
    dst_argb[uVar3 * 4] = src_raw[2];
    dst_argb[uVar3 * 4 + 1] = uVar2;
    dst_argb[uVar3 * 4 + 2] = uVar1;
    dst_argb[uVar3 * 4 + 3] = 0xff;
    src_raw = src_raw + 3;
  }
  return;
}

Assistant:

void RAWToARGBRow_C(const uint8* src_raw, uint8* dst_argb, int width) {
  int x;
  for (x = 0; x < width; ++x) {
    uint8 r = src_raw[0];
    uint8 g = src_raw[1];
    uint8 b = src_raw[2];
    dst_argb[0] = b;
    dst_argb[1] = g;
    dst_argb[2] = r;
    dst_argb[3] = 255u;
    dst_argb += 4;
    src_raw += 3;
  }
}